

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O0

void mi_page_init(mi_heap_t *heap,mi_page_t *page,size_t block_size,mi_tld_t *tld)

{
  _Bool _Var1;
  uint8_t *puVar2;
  size_t sVar3;
  mi_tld_t *in_RCX;
  mi_subproc_t *in_RDX;
  mi_segment_t *in_RSI;
  mi_heap_t *in_RDI;
  size_t page_size;
  mi_segment_t *segment;
  mi_page_t *in_stack_ffffffffffffffd0;
  
  _mi_page_segment(in_stack_ffffffffffffffd0);
  mi_page_set_heap((mi_page_t *)in_RSI,in_RDI);
  in_RSI->subproc = in_RDX;
  puVar2 = _mi_segment_page_start(in_RSI,(mi_page_t *)in_RDX,&in_RCX->heartbeat);
  in_RSI->purge_expire = (mi_msecs_t)puVar2;
  *(short *)((long)&(in_RSI->memid).mem + 0xc) =
       (short)((ulong)in_stack_ffffffffffffffd0 / (ulong)in_RDX);
  *(byte *)((long)&(in_RSI->memid).mem + 0xf) =
       *(byte *)((long)&(in_RSI->memid).mem + 0xf) & 0xfe |
       *(byte *)((long)&(in_RSI->memid).mem + 8) >> 1 & 1;
  if ((in_RDX == (mi_subproc_t *)0x0) || (_Var1 = _mi_is_power_of_two((uintptr_t)in_RDX), !_Var1)) {
    *(undefined1 *)((long)&in_RSI->segment_size + 2) = 0;
  }
  else {
    sVar3 = mi_ctz((size_t)in_RDX);
    *(char *)((long)&in_RSI->segment_size + 2) = (char)sVar3;
  }
  mi_page_extend_free((mi_heap_t *)in_RSI,(mi_page_t *)in_RDX,in_RCX);
  return;
}

Assistant:

static void mi_page_init(mi_heap_t* heap, mi_page_t* page, size_t block_size, mi_tld_t* tld) {
  mi_assert(page != NULL);
  mi_segment_t* segment = _mi_page_segment(page);
  mi_assert(segment != NULL);
  mi_assert_internal(block_size > 0);
  // set fields
  mi_page_set_heap(page, heap);
  page->block_size = block_size;
  size_t page_size;
  page->page_start = _mi_segment_page_start(segment, page, &page_size);
  mi_track_mem_noaccess(page->page_start,page_size);
  mi_assert_internal(mi_page_block_size(page) <= page_size);
  mi_assert_internal(page_size <= page->slice_count*MI_SEGMENT_SLICE_SIZE);
  mi_assert_internal(page_size / block_size < (1L<<16));
  page->reserved = (uint16_t)(page_size / block_size);
  mi_assert_internal(page->reserved > 0);
  #if (MI_PADDING || MI_ENCODE_FREELIST)
  page->keys[0] = _mi_heap_random_next(heap);
  page->keys[1] = _mi_heap_random_next(heap);
  #endif
  page->free_is_zero = page->is_zero_init;
  #if MI_DEBUG>2
  if (page->is_zero_init) {
    mi_track_mem_defined(page->page_start, page_size);
    mi_assert_expensive(mi_mem_is_zero(page->page_start, page_size));
  }
  #endif
  mi_assert_internal(page->is_committed);
  if (block_size > 0 && _mi_is_power_of_two(block_size)) {
    page->block_size_shift = (uint8_t)(mi_ctz((uintptr_t)block_size));
  }
  else {
    page->block_size_shift = 0;
  }

  mi_assert_internal(page->capacity == 0);
  mi_assert_internal(page->free == NULL);
  mi_assert_internal(page->used == 0);
  mi_assert_internal(page->xthread_free == 0);
  mi_assert_internal(page->next == NULL);
  mi_assert_internal(page->prev == NULL);
  mi_assert_internal(page->retire_expire == 0);
  mi_assert_internal(!mi_page_has_aligned(page));
  #if (MI_PADDING || MI_ENCODE_FREELIST)
  mi_assert_internal(page->keys[0] != 0);
  mi_assert_internal(page->keys[1] != 0);
  #endif
  mi_assert_internal(page->block_size_shift == 0 || (block_size == ((size_t)1 << page->block_size_shift)));
  mi_assert_expensive(mi_page_is_valid_init(page));

  // initialize an initial free list
  mi_page_extend_free(heap,page,tld);
  mi_assert(mi_page_immediate_available(page));
}